

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchExpr
          (BinaryReaderInterp *this,Index tag_index)

{
  Index index;
  bool bVar1;
  Offset OVar2;
  size_type sVar3;
  vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *this_00;
  value_type local_c8;
  u32 local_bc;
  reference pvStack_b8;
  Offset offset;
  HandlerDesc *desc;
  Label *label;
  Var local_88;
  Location local_40;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index tag_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = tag_index;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  index = local_1c;
  GetLocation((Location *)&label,this);
  Var::Var(&local_88,index,(Location *)&label);
  local_20 = (Enum)SharedValidator::OnCatch(&this->validator_,&local_40,&local_88,false);
  bVar1 = Failed((Result)local_20);
  Var::~Var(&local_88);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    desc = (HandlerDesc *)TopLabel(this);
    pvStack_b8 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                 ::operator[](&this->func_->handlers,(ulong)*(uint *)&desc->field_0xc);
    pvStack_b8->kind = Catch;
    if (desc->kind == Catch) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    local_bc = desc->try_start_offset;
    Istream::Emit(this->istream_,Br);
    if (local_bc != 0xffffffff) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x68b,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchExpr(Index)"
                   );
    }
    sVar3 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    OVar2 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)sVar3 - 1,OVar2);
    Istream::Emit(this->istream_,local_bc);
    if (pvStack_b8->try_end_offset == 0xffffffff) {
      OVar2 = Istream::end(this->istream_);
      pvStack_b8->try_end_offset = OVar2;
    }
    desc->kind = Catch;
    this_00 = &pvStack_b8->catches;
    local_c8.tag_index = local_1c;
    local_c8.offset = Istream::end(this->istream_);
    local_c8.ref = false;
    std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::push_back
              (this_00,&local_c8);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnCatchExpr(Index tag_index) {
  CHECK_RESULT(
      validator_.OnCatch(GetLocation(), Var(tag_index, GetLocation()), false));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  // Drop the previous block's exception if it was a catch.
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  // Jump to the end of the block at the end of the previous try or catch.
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  // The offset is only set after the first catch block, as the offset range
  // should only cover the try block itself.
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  // The label kind is switched to Block from Try in order to distinguish
  // catch blocks from try blocks. This is used to ensure that a try-delegate
  // inside this catch will not delegate to the catch, and instead find outer
  // try blocks to use as a delegate target.
  label->kind = LabelKind::Block;
  desc.catches.push_back(CatchDesc{tag_index, istream_.end()});
  return Result::Ok;
}